

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

void __thiscall
MempoolAcceptResult::MempoolAcceptResult
          (MempoolAcceptResult *this,
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *replaced_txns,int64_t vsize,CAmount fees,CFeeRate effective_feerate,
          vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          *wtxids_fee_calculations)

{
  long lVar1;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  TxValidationState *in_stack_ffffffffffffff98;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *__t;
  optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = 0;
  __t = (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
        (in_RDI + 2);
  TxValidationState::TxValidationState(in_stack_ffffffffffffff98);
  this_00 = (optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
             *)(in_RDI + 0x14);
  std::__cxx11::
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>::
  list((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        *)in_stack_ffffffffffffff98,
       (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        *)0x81a9aa);
  std::optional<long>::optional<long_&,_true>((optional<long> *)this_00,(long *)__t);
  std::optional<long>::optional<long_&,_true>((optional<long> *)this_00,(long *)__t);
  std::optional<CFeeRate>::optional<CFeeRate_&,_true>((optional<CFeeRate> *)this_00,(CFeeRate *)__t)
  ;
  std::
  optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  ::
  optional<const_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_&,_true>
            (this_00,__t);
  std::optional<uint256>::optional((optional<uint256> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit MempoolAcceptResult(std::list<CTransactionRef>&& replaced_txns,
                                 int64_t vsize,
                                 CAmount fees,
                                 CFeeRate effective_feerate,
                                 const std::vector<Wtxid>& wtxids_fee_calculations)
        : m_result_type(ResultType::VALID),
        m_replaced_transactions(std::move(replaced_txns)),
        m_vsize{vsize},
        m_base_fees(fees),
        m_effective_feerate(effective_feerate),
        m_wtxids_fee_calculations(wtxids_fee_calculations) {}